

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTableTest(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  sqlite3 *db_00;
  sqlite3_context *pCtx;
  uchar *zWhen_00;
  Parse *p;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  int i2;
  int i1;
  int flags;
  int rc;
  sqlite3_xauth xAuth;
  int bNoDQS;
  char *zWhen;
  int isLegacy;
  int bTemp;
  char *zInput;
  char *zDb;
  sqlite3 *db;
  NameContext sNC;
  Parse sParse;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  undefined4 uVar8;
  sqlite3 *db_01;
  undefined4 in_stack_fffffffffffffdd0;
  undefined1 *local_1e8 [5];
  Parse *in_stack_fffffffffffffe40;
  undefined1 local_1b0 [24];
  int local_198;
  int local_17c;
  long local_50;
  long local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = sqlite3_context_db_handle(in_RDI);
  pCtx = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x228576);
  zWhen_00 = sqlite3_value_text((sqlite3_value *)0x228589);
  iVar1 = sqlite3_value_int((sqlite3_value *)0x22859c);
  uVar2 = (uint)db_00->flags & 0x4000000;
  p = (Parse *)sqlite3_value_text((sqlite3_value *)0x2285c1);
  iVar3 = sqlite3_value_int((sqlite3_value *)0x2285d4);
  db_01 = (sqlite3 *)db_00->xAuth;
  db_00->xAuth = (sqlite3_xauth)0x0;
  if ((pCtx != (sqlite3_context *)0x0) && (zWhen_00 != (uchar *)0x0)) {
    uVar8 = 0xaaaaaaaa;
    memset(local_1b0,0xaa,0x1a8);
    uVar4 = (uint)db_00->flags;
    if (iVar3 != 0) {
      db_00->flags = db_00->flags & 0xffffffff9fffffff;
    }
    iVar5 = renameParseSql(p,(char *)CONCAT44(iVar3,in_stack_fffffffffffffdd0),db_01,
                           (char *)CONCAT44(uVar8,uVar4),in_stack_fffffffffffffdbc);
    db_00->flags = (long)(int)(uVar4 & 0x60000000) | db_00->flags;
    if (iVar5 == 0) {
      if (((uVar2 == 0) && (local_50 != 0)) && (*(char *)(local_50 + 0x3f) == '\x02')) {
        memset(local_1e8,0xaa,0x38);
        memset(local_1e8,0,0x38);
        local_1e8[0] = local_1b0;
        sqlite3SelectPrep((Parse *)CONCAT44(iVar5,uVar4),
                          (Select *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                          (NameContext *)0x228718);
        if (local_17c != 0) {
          iVar5 = local_198;
        }
      }
      else if (local_40 != 0) {
        if (uVar2 == 0) {
          iVar5 = renameResolveTrigger(in_stack_fffffffffffffe40);
        }
        if (iVar5 == 0) {
          iVar7 = sqlite3SchemaToIndex(db_00,*(Schema **)(local_40 + 0x30));
          iVar6 = sqlite3FindDbName((sqlite3 *)CONCAT44(iVar3,in_stack_fffffffffffffdd0),
                                    (char *)db_01);
          if (iVar7 == iVar6) {
            sqlite3_result_int((sqlite3_context *)CONCAT44(iVar5,uVar4),iVar7);
          }
        }
      }
    }
    if (((iVar5 != 0) && (p != (Parse *)0x0)) && (iVar7 = sqlite3WritableSchema(db_00), iVar7 == 0))
    {
      renameColumnParseError
                (pCtx,(char *)zWhen_00,(sqlite3_value *)CONCAT44(iVar1,uVar2),(sqlite3_value *)p,
                 (Parse *)CONCAT44(iVar3,in_stack_fffffffffffffdd0));
    }
    renameParseCleanup((Parse *)CONCAT44(iVar5,uVar4));
  }
  db_00->xAuth = (sqlite3_xauth)db_01;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void renameTableTest(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);
  int bTemp = sqlite3_value_int(argv[4]);
  int isLegacy = (db->flags & SQLITE_LegacyAlter);
  char const *zWhen = (const char*)sqlite3_value_text(argv[5]);
  int bNoDQS = sqlite3_value_int(argv[6]);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);

  if( zDb && zInput ){
    int rc;
    Parse sParse;
    int flags = db->flags;
    if( bNoDQS ) db->flags &= ~(SQLITE_DqsDML|SQLITE_DqsDDL);
    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);
    db->flags |= (flags & (SQLITE_DqsDML|SQLITE_DqsDDL));
    if( rc==SQLITE_OK ){
      if( isLegacy==0 && sParse.pNewTable && IsView(sParse.pNewTable) ){
        NameContext sNC;
        memset(&sNC, 0, sizeof(sNC));
        sNC.pParse = &sParse;
        sqlite3SelectPrep(&sParse, sParse.pNewTable->u.view.pSelect, &sNC);
        if( sParse.nErr ) rc = sParse.rc;
      }

      else if( sParse.pNewTrigger ){
        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
        }
        if( rc==SQLITE_OK ){
          int i1 = sqlite3SchemaToIndex(db, sParse.pNewTrigger->pTabSchema);
          int i2 = sqlite3FindDbName(db, zDb);
          if( i1==i2 ){
            /* Handle output case B */
            sqlite3_result_int(context, 1);
          }
        }
      }
    }

    if( rc!=SQLITE_OK && zWhen && !sqlite3WritableSchema(db) ){
      /* Output case A */
      renameColumnParseError(context, zWhen, argv[2], argv[3],&sParse);
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
}